

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestGIT.cxx
# Opt level: O2

bool __thiscall cmCTestGIT::UpdateByFetchAndReset(cmCTestGIT *this)

{
  cmCTest *pcVar1;
  bool bVar2;
  ostream *poVar3;
  long lVar4;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  allocator_type local_3da;
  allocator<char> local_3d9;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  git_reset;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  git_fetch;
  string sha1;
  OutputLogger reset_err;
  string opts;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  args;
  OutputLogger fetch_out;
  string local_2b8;
  string git;
  OutputLogger fetch_err;
  OutputLogger reset_out;
  string local_1f8 [32];
  string local_1d8 [424];
  
  std::__cxx11::string::string
            ((string *)&git,(string *)&(this->super_cmCTestGlobalVC).super_cmCTestVC.CommandLineTool
            );
  git_fetch.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  git_fetch.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  git_fetch.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&git_fetch,&git);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<char_const(&)[6]>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&git_fetch,
             (char (*) [6])"fetch");
  pcVar1 = (this->super_cmCTestGlobalVC).super_cmCTestVC.CTest;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&reset_out,"UpdateOptions",(allocator<char> *)&fetch_out);
  cmCTest::GetCTestConfiguration(&opts,pcVar1,(string *)&reset_out);
  std::__cxx11::string::~string((string *)&reset_out);
  if (opts._M_string_length == 0) {
    pcVar1 = (this->super_cmCTestGlobalVC).super_cmCTestVC.CTest;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&fetch_out,"GITUpdateOptions",(allocator<char> *)&fetch_err);
    cmCTest::GetCTestConfiguration((string *)&reset_out,pcVar1,(string *)&fetch_out);
    std::__cxx11::string::operator=((string *)&opts,(string *)&reset_out);
    std::__cxx11::string::~string((string *)&reset_out);
    std::__cxx11::string::~string((string *)&fetch_out);
  }
  cmSystemTools::ParseArguments(&args,&opts);
  ::cm::
  append<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_0>
            (&git_fetch,&args);
  cmProcessTools::OutputLogger::OutputLogger
            (&fetch_out,(this->super_cmCTestGlobalVC).super_cmCTestVC.Log,"fetch-out> ");
  cmProcessTools::OutputLogger::OutputLogger
            (&fetch_err,(this->super_cmCTestGlobalVC).super_cmCTestVC.Log,"fetch-err> ");
  bVar2 = cmCTestVC::RunUpdateCommand
                    ((cmCTestVC *)this,&git_fetch,(OutputParser *)&fetch_out,
                     (OutputParser *)&fetch_err,Auto);
  if (bVar2) {
    sha1._M_dataplus._M_p = (pointer)&sha1.field_2;
    sha1._M_string_length = 0;
    sha1.field_2._M_local_buf[0] = '\0';
    FindGitDir_abi_cxx11_((string *)&reset_out,this);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&reset_err,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&reset_out,
                   "/FETCH_HEAD");
    std::__cxx11::string::~string((string *)&reset_out);
    std::ifstream::ifstream
              (&reset_out,(char *)reset_err.super_LineParser.super_OutputParser._vptr_OutputParser,
               _S_in|_S_bin);
    if ((*(byte *)((long)&reset_out.super_LineParser.Line._M_string_length +
                  (long)reset_out.super_LineParser.super_OutputParser._vptr_OutputParser[-3]) & 5)
        == 0) {
      git_reset.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start =
           (pointer)&git_reset.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage;
      git_reset.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      git_reset.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
      while (sha1._M_string_length == 0) {
        bVar2 = cmsys::SystemTools::GetLineFromStream
                          ((istream *)&reset_out,(string *)&git_reset,(bool *)0x0,0xffffffffffffffff
                          );
        if (!bVar2) {
          if (sha1._M_string_length == 0) {
            std::operator<<((this->super_cmCTestGlobalVC).super_cmCTestVC.Log,
                            "FETCH_HEAD has no upstream branch candidate!\n");
            std::__cxx11::string::~string((string *)&git_reset);
            goto LAB_001f5c92;
          }
          break;
        }
        poVar3 = std::operator<<((this->super_cmCTestGlobalVC).super_cmCTestVC.Log,"FETCH_HEAD> ");
        poVar3 = std::operator<<(poVar3,(string *)&git_reset);
        std::operator<<(poVar3,"\n");
        lVar4 = std::__cxx11::string::find((char *)&git_reset,0x7139d3);
        if (lVar4 == -1) {
          lVar4 = std::__cxx11::string::find((char)(string *)&git_reset,9);
          if (lVar4 != -1) {
            std::__cxx11::string::operator=((string *)&sha1,(string *)&git_reset);
            std::__cxx11::string::resize((ulong)&sha1);
          }
        }
      }
      std::__cxx11::string::~string((string *)&git_reset);
      std::ifstream::~ifstream(&reset_out);
      std::__cxx11::string::~string((string *)&reset_err);
      std::__cxx11::string::string((string *)&reset_out,(string *)&git);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&reset_out.super_LineParser.Line._M_string_length,"reset",
                 (allocator<char> *)&reset_err);
      std::__cxx11::string::string<std::allocator<char>>(local_1f8,"--hard",&local_3d9);
      std::__cxx11::string::string(local_1d8,(string *)&sha1);
      __l._M_len = 4;
      __l._M_array = (iterator)&reset_out;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(&git_reset,__l,&local_3da);
      lVar4 = 0x60;
      do {
        std::__cxx11::string::~string(local_1f8 + lVar4 + -0x40);
        lVar4 = lVar4 + -0x20;
      } while (lVar4 != -0x20);
      cmProcessTools::OutputLogger::OutputLogger
                (&reset_out,(this->super_cmCTestGlobalVC).super_cmCTestVC.Log,"reset-out> ");
      cmProcessTools::OutputLogger::OutputLogger
                (&reset_err,(this->super_cmCTestGlobalVC).super_cmCTestVC.Log,"reset-err> ");
      local_2b8._M_dataplus._M_p = (pointer)&local_2b8.field_2;
      local_2b8._M_string_length = 0;
      local_2b8.field_2._M_local_buf[0] = '\0';
      bVar2 = cmCTestVC::RunChild((cmCTestVC *)this,&git_reset,(OutputParser *)&reset_out,
                                  (OutputParser *)&reset_err,&local_2b8,Auto);
      std::__cxx11::string::~string((string *)&local_2b8);
      cmProcessTools::LineParser::~LineParser(&reset_err.super_LineParser);
      cmProcessTools::LineParser::~LineParser(&reset_out.super_LineParser);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&git_reset);
    }
    else {
      poVar3 = std::operator<<((this->super_cmCTestGlobalVC).super_cmCTestVC.Log,"Unable to open ");
      poVar3 = std::operator<<(poVar3,(string *)&reset_err);
      std::operator<<(poVar3,"\n");
LAB_001f5c92:
      std::ifstream::~ifstream(&reset_out);
      std::__cxx11::string::~string((string *)&reset_err);
      bVar2 = false;
    }
    std::__cxx11::string::~string((string *)&sha1);
  }
  else {
    bVar2 = false;
  }
  cmProcessTools::LineParser::~LineParser(&fetch_err.super_LineParser);
  cmProcessTools::LineParser::~LineParser(&fetch_out.super_LineParser);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&args);
  std::__cxx11::string::~string((string *)&opts);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&git_fetch);
  std::__cxx11::string::~string((string *)&git);
  return bVar2;
}

Assistant:

bool cmCTestGIT::UpdateByFetchAndReset()
{
  std::string git = this->CommandLineTool;

  // Use "git fetch" to get remote commits.
  std::vector<std::string> git_fetch;
  git_fetch.push_back(git);
  git_fetch.emplace_back("fetch");

  // Add user-specified update options.
  std::string opts = this->CTest->GetCTestConfiguration("UpdateOptions");
  if (opts.empty()) {
    opts = this->CTest->GetCTestConfiguration("GITUpdateOptions");
  }
  std::vector<std::string> args = cmSystemTools::ParseArguments(opts);
  cm::append(git_fetch, args);

  // Fetch upstream refs.
  OutputLogger fetch_out(this->Log, "fetch-out> ");
  OutputLogger fetch_err(this->Log, "fetch-err> ");
  if (!this->RunUpdateCommand(git_fetch, &fetch_out, &fetch_err)) {
    return false;
  }

  // Identify the merge head that would be used by "git pull".
  std::string sha1;
  {
    std::string fetch_head = this->FindGitDir() + "/FETCH_HEAD";
    cmsys::ifstream fin(fetch_head.c_str(), std::ios::in | std::ios::binary);
    if (!fin) {
      this->Log << "Unable to open " << fetch_head << "\n";
      return false;
    }
    std::string line;
    while (sha1.empty() && cmSystemTools::GetLineFromStream(fin, line)) {
      this->Log << "FETCH_HEAD> " << line << "\n";
      if (line.find("\tnot-for-merge\t") == std::string::npos) {
        std::string::size_type pos = line.find('\t');
        if (pos != std::string::npos) {
          sha1 = std::move(line);
          sha1.resize(pos);
        }
      }
    }
    if (sha1.empty()) {
      this->Log << "FETCH_HEAD has no upstream branch candidate!\n";
      return false;
    }
  }

  // Reset the local branch to point at that tracked from upstream.
  std::vector<std::string> git_reset = { git, "reset", "--hard", sha1 };
  OutputLogger reset_out(this->Log, "reset-out> ");
  OutputLogger reset_err(this->Log, "reset-err> ");
  return this->RunChild(git_reset, &reset_out, &reset_err);
}